

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

void imdct_step3_inner_r_loop(int lim,float *e,int d0,int k_off,float *A,int k1)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (0 < lim >> 2) {
    pfVar1 = e + d0;
    lVar2 = (long)k_off;
    lVar3 = (long)k1;
    uVar4 = (lim >> 2) + 1;
    do {
      fVar5 = *pfVar1;
      fVar7 = pfVar1[lVar2];
      fVar6 = pfVar1[-1] - pfVar1[lVar2 + -1];
      *pfVar1 = fVar5 + fVar7;
      fVar5 = fVar5 - fVar7;
      pfVar1[-1] = pfVar1[-1] + pfVar1[lVar2 + -1];
      pfVar1[lVar2] = *A * fVar5 - A[1] * fVar6;
      pfVar1[lVar2 + -1] = fVar6 * *A + fVar5 * A[1];
      fVar5 = pfVar1[-2] - pfVar1[lVar2 + -2];
      fVar7 = pfVar1[-3] - pfVar1[lVar2 + -3];
      pfVar1[-2] = pfVar1[-2] + pfVar1[lVar2 + -2];
      pfVar1[-3] = pfVar1[-3] + pfVar1[lVar2 + -3];
      pfVar1[lVar2 + -2] = A[lVar3] * fVar5 - A[lVar3 + 1] * fVar7;
      pfVar1[lVar2 + -3] = fVar7 * A[lVar3] + fVar5 * A[lVar3 + 1];
      fVar5 = pfVar1[-4];
      fVar7 = pfVar1[lVar2 + -4];
      fVar6 = pfVar1[-5] - pfVar1[lVar2 + -5];
      pfVar1[-4] = fVar5 + fVar7;
      fVar5 = fVar5 - fVar7;
      pfVar1[-5] = pfVar1[-5] + pfVar1[lVar2 + -5];
      pfVar1[lVar2 + -4] = A[lVar3 * 2] * fVar5 - A[lVar3 * 2 + 1] * fVar6;
      pfVar1[lVar2 + -5] = fVar6 * A[lVar3 * 2] + fVar5 * A[lVar3 * 2 + 1];
      fVar5 = pfVar1[-6] - pfVar1[lVar2 + -6];
      fVar7 = pfVar1[-7] - pfVar1[lVar2 + -7];
      pfVar1[-6] = pfVar1[-6] + pfVar1[lVar2 + -6];
      pfVar1[-7] = pfVar1[-7] + pfVar1[lVar2 + -7];
      pfVar1[lVar2 + -6] = A[lVar3 * 3] * fVar5 - A[lVar3 * 3 + 1] * fVar7;
      pfVar1[lVar2 + -7] = fVar7 * A[lVar3 * 3] + fVar5 * A[lVar3 * 3 + 1];
      pfVar1 = pfVar1 + -8;
      uVar4 = uVar4 - 1;
      A = A + lVar3 * 4;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

static void imdct_step3_inner_r_loop(int lim, float *e, int d0, int k_off, float *A, int k1)
{
   int i;
   float k00_20, k01_21;

   float *e0 = e + d0;
   float *e2 = e0 + k_off;

   for (i=lim >> 2; i > 0; --i) {
      k00_20 = e0[-0] - e2[-0];
      k01_21 = e0[-1] - e2[-1];
      e0[-0] += e2[-0];//e0[-0] = e0[-0] + e2[-0];
      e0[-1] += e2[-1];//e0[-1] = e0[-1] + e2[-1];
      e2[-0] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-1] = (k01_21)*A[0] + (k00_20) * A[1];

      A += k1;

      k00_20 = e0[-2] - e2[-2];
      k01_21 = e0[-3] - e2[-3];
      e0[-2] += e2[-2];//e0[-2] = e0[-2] + e2[-2];
      e0[-3] += e2[-3];//e0[-3] = e0[-3] + e2[-3];
      e2[-2] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-3] = (k01_21)*A[0] + (k00_20) * A[1];

      A += k1;

      k00_20 = e0[-4] - e2[-4];
      k01_21 = e0[-5] - e2[-5];
      e0[-4] += e2[-4];//e0[-4] = e0[-4] + e2[-4];
      e0[-5] += e2[-5];//e0[-5] = e0[-5] + e2[-5];
      e2[-4] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-5] = (k01_21)*A[0] + (k00_20) * A[1];

      A += k1;

      k00_20 = e0[-6] - e2[-6];
      k01_21 = e0[-7] - e2[-7];
      e0[-6] += e2[-6];//e0[-6] = e0[-6] + e2[-6];
      e0[-7] += e2[-7];//e0[-7] = e0[-7] + e2[-7];
      e2[-6] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-7] = (k01_21)*A[0] + (k00_20) * A[1];

      e0 -= 8;
      e2 -= 8;

      A += k1;
   }
}